

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O1

SEQNUM __thiscall
FIX::MessageStoreExceptionWrapper::getNextSenderMsgSeqNum
          (MessageStoreExceptionWrapper *this,bool *threw,IOException *ex)

{
  SEQNUM SVar1;
  
  *threw = false;
  SVar1 = (**(code **)(**(long **)this + 0x20))();
  return SVar1;
}

Assistant:

SEQNUM MessageStoreExceptionWrapper::getNextSenderMsgSeqNum(bool &threw, IOException &ex) const {
  threw = false;
  try {
    return m_pStore->getNextSenderMsgSeqNum();
  } catch (IOException &e) {
    threw = true;
    ex = e;
    return 0;
  }
}